

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O3

MemoryProfiler * MemoryProfiler::EnsureMemoryProfiler(void)

{
  long *plVar1;
  BasePtr<MemoryProfiler> this;
  
  plVar1 = (long *)__tls_get_addr(&PTR_01548c30);
  this.ptr = (MemoryProfiler *)*plVar1;
  if (this.ptr == (MemoryProfiler *)0x0) {
    this.ptr = (MemoryProfiler *)
               Memory::NoCheckHeapAllocator::Alloc
                         ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x428);
    MemoryProfiler(this.ptr);
    CCLock::Enter(&s_cs.super_CCLock);
    (this.ptr)->next = (MemoryProfiler *)profilers.super_BasePtr<MemoryProfiler>.ptr;
    profilers.super_BasePtr<MemoryProfiler>.ptr =
         (BasePtr<MemoryProfiler>)(BasePtr<MemoryProfiler>)this.ptr;
    CCLock::Leave(&s_cs.super_CCLock);
    *plVar1 = (long)this.ptr;
  }
  return this.ptr;
}

Assistant:

MemoryProfiler *
MemoryProfiler::EnsureMemoryProfiler()
{
    MemoryProfiler * memoryProfiler = MemoryProfiler::Instance;

    if (memoryProfiler == nullptr)
    {
        memoryProfiler = NoCheckHeapNew(MemoryProfiler);

        {
            AutoCriticalSection autocs(&s_cs);
            memoryProfiler->next = MemoryProfiler::profilers.Detach();
            MemoryProfiler::profilers = memoryProfiler;
        }

        MemoryProfiler::Instance = memoryProfiler;
    }
    return memoryProfiler;
}